

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

bool __thiscall c4::yml::Parser::_rval_dash_start_or_continue_seq(Parser *this)

{
  pfn_error p_Var1;
  code *pcVar2;
  Location LVar3;
  bool bVar4;
  undefined1 uVar5;
  size_t sVar6;
  State *pSVar7;
  ulong uVar8;
  csubstr cVar9;
  char *pcStack_58;
  size_t local_50;
  char msg [39];
  
  sVar6 = LineContents::current_col(&this->m_state->line_contents);
  pSVar7 = this->m_state;
  uVar8 = pSVar7->indref;
  if (sVar6 < uVar8) {
    builtin_strncpy(msg,"check failed: (ind >= m_state->indref)",0x27);
    if (((byte)s_error_flags & 1) != 0) {
      bVar4 = is_debugger_attached();
      if (bVar4) {
        pcVar2 = (code *)swi(3);
        uVar5 = (*pcVar2)();
        return (bool)uVar5;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar9 = to_csubstr(
                      "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                      );
    local_50 = cVar9.len;
    pcStack_58 = cVar9.str;
    LVar3.super_LineCol.col = 0;
    LVar3.super_LineCol.offset = SUB168(ZEXT816(0x6f0e) << 0x40,0);
    LVar3.super_LineCol.line = SUB168(ZEXT816(0x6f0e) << 0x40,8);
    LVar3.name.str = pcStack_58;
    LVar3.name.len = local_50;
    (*p_Var1)(msg,0x27,LVar3,(this->m_stack).m_callbacks.m_user_data);
    pSVar7 = this->m_state;
    uVar8 = pSVar7->indref;
  }
  pSVar7->flags = pSVar7->flags & 0xfffffe7fU | 0x100;
  if (sVar6 == uVar8) {
    if ((pSVar7->line_contents).full.len <= sVar6) {
      if (((byte)s_error_flags & 1) != 0) {
        bVar4 = is_debugger_attached();
        if (bVar4) {
          pcVar2 = (code *)swi(3);
          uVar5 = (*pcVar2)();
          return (bool)uVar5;
        }
      }
      handle_error(0x22b919,
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   ,0x14c3,"i >= 0 && i < len");
    }
    _append_val_null(this,(pSVar7->line_contents).full.str + sVar6);
  }
  else {
    _push_level(this,false);
    _start_seq(this,true);
    _save_indentation(this,0);
  }
  return sVar6 != uVar8;
}

Assistant:

bool Parser::_rval_dash_start_or_continue_seq()
{
    size_t ind = m_state->line_contents.current_col();
    _RYML_CB_ASSERT(m_stack.m_callbacks, ind >= m_state->indref);
    size_t delta_ind = ind - m_state->indref;
    if( ! delta_ind)
    {
        _c4dbgp("prev val was empty");
        addrem_flags(RNXT, RVAL);
        _append_val_null(&m_state->line_contents.full[ind]);
        return false;
    }
    _c4dbgp("val is a nested seq, indented");
    addrem_flags(RNXT, RVAL); // before _push_level!
    _push_level();
    _start_seq();
    _save_indentation();
    return true;
}